

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O0

int * Expr_Mod(int *dest,int *xnode,FXlatExprState *state)

{
  int local_28;
  int local_24;
  int op2;
  int op1;
  FXlatExprState *state_local;
  int *xnode_local;
  int *dest_local;
  
  _op2 = state;
  state_local = (FXlatExprState *)xnode;
  xnode_local = dest;
  state_local = (FXlatExprState *)(*XlatExprEval[xnode[-1]])(&local_28,xnode + -1,state);
  state_local = (FXlatExprState *)
                (*XlatExprEval[state_local->linetype])(&local_24,(int *)state_local,_op2);
  Div0Check(&local_24,&local_28,_op2);
  *xnode_local = local_24 % local_28;
  return &state_local->linetype;
}

Assistant:

static const int *Expr_Mod(int *dest, const int *xnode, FXlatExprState *state)
{
	int op1, op2;

	xnode = XlatExprEval[xnode[-1]](&op2, xnode-1, state);
	xnode = XlatExprEval[xnode[0]](&op1, xnode, state);
	Div0Check(op1, op2, state);
	*dest = op1 % op2;
	return xnode;
}